

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O0

bool __thiscall libcellml::Annotator::assignIds(Annotator *this,CellmlElementType type)

{
  ulong uVar1;
  bool bVar2;
  AnnotatorImpl *pAVar3;
  element_type *peVar4;
  size_t sVar5;
  ComponentEntity local_60;
  ulong local_50;
  size_t index;
  size_t initialSize;
  undefined1 local_30 [8];
  shared_ptr<libcellml::Model> model;
  CellmlElementType type_local;
  Annotator *this_local;
  
  model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       type;
  pFunc(this);
  std::weak_ptr<libcellml::Model>::lock((weak_ptr<libcellml::Model> *)local_30);
  bVar2 = std::operator==((shared_ptr<libcellml::Model> *)local_30,(nullptr_t)0x0);
  if (bVar2) {
    pAVar3 = pFunc(this);
    AnnotatorImpl::addIssueNoModel(pAVar3);
    this_local._7_1_ = false;
  }
  else {
    pAVar3 = pFunc(this);
    index = AnnotatorImpl::idCount(pAVar3);
    switch(model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
           _4_4_) {
    case COMPONENT:
    case COMPONENT_REF:
    case CONNECTION:
    case MAP_VARIABLES:
    case RESET:
    case RESET_VALUE:
    case TEST_VALUE:
    case VARIABLE:
      local_50 = 0;
      while( true ) {
        uVar1 = local_50;
        peVar4 = std::
                 __shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_30);
        sVar5 = ComponentEntity::componentCount(&peVar4->super_ComponentEntity);
        if (sVar5 <= uVar1) break;
        pAVar3 = pFunc(this);
        peVar4 = std::
                 __shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_30);
        ComponentEntity::component(&local_60,(size_t)peVar4);
        AnnotatorImpl::doSetComponentTreeTypeIds
                  (pAVar3,(ComponentPtr *)&local_60,
                   model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi._4_4_,false);
        std::shared_ptr<libcellml::Component>::~shared_ptr
                  ((shared_ptr<libcellml::Component> *)&local_60);
        local_50 = local_50 + 1;
      }
      break;
    case ENCAPSULATION:
      pAVar3 = pFunc(this);
      AnnotatorImpl::doSetEncapsulationIds(pAVar3);
      break;
    case IMPORT:
      pAVar3 = pFunc(this);
      AnnotatorImpl::doSetImportSourceIds(pAVar3);
      break;
    case MATH:
    default:
      break;
    case MODEL:
      pAVar3 = pFunc(this);
      AnnotatorImpl::doSetModelIds(pAVar3);
      break;
    case UNIT:
      pAVar3 = pFunc(this);
      AnnotatorImpl::doSetUnitsItemIds(pAVar3);
      break;
    case UNITS:
      pAVar3 = pFunc(this);
      AnnotatorImpl::doSetUnitsIds(pAVar3);
    }
    setModel(this,(ModelPtr *)local_30);
    pAVar3 = pFunc(this);
    sVar5 = AnnotatorImpl::idCount(pAVar3);
    this_local._7_1_ = index < sVar5;
  }
  initialSize._0_4_ = 1;
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_30);
  return this_local._7_1_;
}

Assistant:

bool Annotator::assignIds(CellmlElementType type)
{
    auto model = pFunc()->mModel.lock();
    if (model == nullptr) {
        pFunc()->addIssueNoModel();
        return false;
    }

    size_t initialSize = pFunc()->idCount();

    switch (type) {
    case CellmlElementType::COMPONENT:
    case CellmlElementType::COMPONENT_REF:
    case CellmlElementType::CONNECTION:
    case CellmlElementType::MAP_VARIABLES:
    case CellmlElementType::RESET:
    case CellmlElementType::RESET_VALUE:
    case CellmlElementType::TEST_VALUE:
    case CellmlElementType::VARIABLE:
        for (size_t index = 0; index < model->componentCount(); ++index) {
            pFunc()->doSetComponentTreeTypeIds(model->component(index), type);
        }
        break;
    case CellmlElementType::ENCAPSULATION:
        pFunc()->doSetEncapsulationIds();
        break;
    case CellmlElementType::IMPORT:
        pFunc()->doSetImportSourceIds();
        break;
    case CellmlElementType::MODEL:
        pFunc()->doSetModelIds();
        break;
    case CellmlElementType::UNIT:
        pFunc()->doSetUnitsItemIds();
        break;
    case CellmlElementType::UNITS:
        pFunc()->doSetUnitsIds();
        break;
    case CellmlElementType::MATH:
    default: /* case CellmlElementType::UNDEFINED */
        break;
    }

    setModel(model);

    return pFunc()->idCount() > initialSize;
}